

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String __thiscall doctest::Approx::toString(Approx *this)

{
  long in_RSI;
  String local_48 [3];
  String local_30;
  String local_28;
  String local_20 [2];
  Approx *this_local;
  
  this_local = this;
  String::String(&local_28,"Approx( ");
  doctest::toString((doctest *)&local_30,*(double *)(in_RSI + 0x10));
  String::operator+(local_20,&local_28);
  String::String(local_48," )");
  String::operator+((String *)this,local_20);
  String::~String(local_48);
  String::~String(local_20);
  String::~String(&local_30);
  String::~String(&local_28);
  return (String)(char *)this;
}

Assistant:

String Approx::toString() const { return String("Approx( ") + doctest::toString(m_value) + " )"; }